

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.c
# Opt level: O1

SRes LzmaEnc_WriteProperties(CLzmaEncHandle pp,Byte *props,SizeT *size)

{
  uint uVar1;
  SRes SVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  Byte *pBVar6;
  CLzmaEnc *p;
  
  SVar2 = 5;
  if (4 < *size) {
    uVar1 = *(uint *)((long)pp + 0xac);
    *size = 5;
    *props = ((char)*(undefined4 *)((long)pp + 0x68) * '\x05' +
             (char)*(undefined4 *)((long)pp + 100)) * '\t' + (char)*(undefined4 *)((long)pp + 0x60);
    if (uVar1 < 0x400000) {
      iVar3 = 0xb;
      do {
        uVar5 = 2 << ((byte)iVar3 & 0x1f);
        if ((uVar1 <= uVar5) || (uVar5 = 3 << ((byte)iVar3 & 0x1f), uVar1 <= uVar5)) break;
        iVar3 = iVar3 + 1;
        uVar5 = uVar1;
      } while (iVar3 != 0x1f);
    }
    else {
      uVar5 = uVar1 + 0xfffff & 0xfff00000;
      if (0xffefffff < uVar1) {
        uVar5 = uVar1;
      }
    }
    pBVar6 = props + 1;
    SVar2 = 0;
    lVar4 = 0;
    do {
      *pBVar6 = (Byte)(uVar5 >> ((byte)lVar4 & 0x1f));
      lVar4 = lVar4 + 8;
      pBVar6 = pBVar6 + 1;
    } while (lVar4 != 0x20);
  }
  return SVar2;
}

Assistant:

SRes LzmaEnc_WriteProperties(CLzmaEncHandle pp, Byte *props, SizeT *size)
{
  CLzmaEnc *p = (CLzmaEnc *)pp;
  unsigned i;
  UInt32 dictSize = p->dictSize;
  if (*size < LZMA_PROPS_SIZE)
    return SZ_ERROR_PARAM;
  *size = LZMA_PROPS_SIZE;
  props[0] = (Byte)((p->pb * 5 + p->lp) * 9 + p->lc);

  if (dictSize >= ((UInt32)1 << 22))
  {
    UInt32 kDictMask = ((UInt32)1 << 20) - 1;
    if (dictSize < (UInt32)0xFFFFFFFF - kDictMask)
      dictSize = (dictSize + kDictMask) & ~kDictMask;
  }
  else for (i = 11; i <= 30; i++)
  {
    if (dictSize <= ((UInt32)2 << i)) { dictSize = (2 << i); break; }
    if (dictSize <= ((UInt32)3 << i)) { dictSize = (3 << i); break; }
  }

  for (i = 0; i < 4; i++)
    props[1 + i] = (Byte)(dictSize >> (8 * i));
  return SZ_OK;
}